

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ins_stack.cpp
# Opt level: O0

int do_push(void)

{
  undefined4 *puVar1;
  uint num_1;
  uint num;
  uint8_t high;
  
  registe_ptr->SP = registe_ptr->SP + 4;
  if (code_ptr[registe_ptr->IP + 1] == '\x05') {
    *(uint *)(stack_ptr + registe_ptr->SP) =
         *register_list[(byte)code_ptr[registe_ptr->IP + 2] / 0x10];
  }
  else {
    if (code_ptr[registe_ptr->IP + 1] != '\x06') {
      puVar1 = (undefined4 *)__cxa_allocate_exception(4);
      *puVar1 = 0xf6;
      __cxa_throw(puVar1,&int::typeinfo,0);
    }
    *(undefined4 *)(stack_ptr + registe_ptr->SP) =
         *(undefined4 *)(code_ptr + (ulong)registe_ptr->IP + 2);
  }
  return 1;
}

Assistant:

int do_push() {
	registe_ptr->SP += 4;//栈指针增加
	if (code_ptr[registe_ptr->IP + 1] == 5) {//寄存器压栈
		uint8_t high = (uint8_t)code_ptr[registe_ptr->IP + 2] / 0x10;
		unsigned num = *register_list[high];
		*(unsigned*)(stack_ptr + registe_ptr->SP) = num;
	}
	else if (code_ptr[registe_ptr->IP + 1] == 6) {//立即数压栈
		unsigned num = *(unsigned*)(code_ptr + registe_ptr->IP + 2);
		*(unsigned*)(stack_ptr + registe_ptr->SP) = num;
	}
	else throw(LVM_EXECUTE_ERROR);
	return LVM_SUCCESS;
}